

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXMLSafe.cxx
# Opt level: O2

int testXMLSafe(int param_1,char **param_2)

{
  char *__rhs;
  bool bVar1;
  test_pair *ptVar2;
  int iVar3;
  string out;
  cmXMLSafe xs;
  ostringstream oss;
  
  iVar3 = 0;
  for (ptVar2 = pairs; ptVar2->in != (char *)0x0; ptVar2 = ptVar2 + 1) {
    cmXMLSafe::cmXMLSafe(&xs,ptVar2->in);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    operator<<((ostream *)&oss,&xs);
    std::__cxx11::stringbuf::str();
    __rhs = ptVar2->out;
    bVar1 = std::operator!=(&out,__rhs);
    if (bVar1) {
      printf("expected [%s], got [%s]\n",__rhs,out._M_dataplus._M_p);
      iVar3 = 1;
    }
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  }
  return iVar3;
}

Assistant:

int testXMLSafe(int /*unused*/, char* /*unused*/[])
{
  int result = 0;
  for (test_pair const* p = pairs; p->in; ++p) {
    cmXMLSafe xs(p->in);
    std::ostringstream oss;
    oss << xs;
    std::string out = oss.str();
    if (out != p->out) {
      printf("expected [%s], got [%s]\n", p->out, out.c_str());
      result = 1;
    }
  }
  return result;
}